

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O0

void __thiscall
RandomizerOptions::RandomizerOptions
          (RandomizerOptions *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *spawn_location_names)

{
  bool bVar1;
  byte bVar2;
  rep rVar3;
  size_type sVar4;
  LandstalkerException *this_00;
  ostream *poVar5;
  undefined1 local_418 [8];
  Json preset_json;
  string local_400;
  undefined1 local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long local_398;
  ifstream preset_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string preset_path;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string permalink_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *spawn_location_names_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *item_names_local;
  ArgumentDictionary *args_local;
  RandomizerOptions *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::map(&this->_item_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_spawn_location_names);
  this->_goal = '\0';
  this->_jewel_count = '\x02';
  this->_use_armor_upgrades = true;
  this->_starting_life = '\0';
  this->_starting_gold = 0;
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x30] = '\0';
  (this->_starting_items)._M_elems[0x31] = '\0';
  (this->_starting_items)._M_elems[0x32] = '\0';
  (this->_starting_items)._M_elems[0x33] = '\0';
  (this->_starting_items)._M_elems[0x34] = '\0';
  (this->_starting_items)._M_elems[0x35] = '\0';
  (this->_starting_items)._M_elems[0x36] = '\0';
  (this->_starting_items)._M_elems[0x37] = '\0';
  (this->_starting_items)._M_elems[0x38] = '\0';
  (this->_starting_items)._M_elems[0x39] = '\0';
  (this->_starting_items)._M_elems[0x3a] = '\0';
  (this->_starting_items)._M_elems[0x3b] = '\0';
  (this->_starting_items)._M_elems[0x3c] = '\0';
  (this->_starting_items)._M_elems[0x3d] = '\0';
  (this->_starting_items)._M_elems[0x20] = '\0';
  (this->_starting_items)._M_elems[0x21] = '\0';
  (this->_starting_items)._M_elems[0x22] = '\0';
  (this->_starting_items)._M_elems[0x23] = '\0';
  (this->_starting_items)._M_elems[0x24] = '\0';
  (this->_starting_items)._M_elems[0x25] = '\0';
  (this->_starting_items)._M_elems[0x26] = '\0';
  (this->_starting_items)._M_elems[0x27] = '\0';
  (this->_starting_items)._M_elems[0x28] = '\0';
  (this->_starting_items)._M_elems[0x29] = '\0';
  (this->_starting_items)._M_elems[0x2a] = '\0';
  (this->_starting_items)._M_elems[0x2b] = '\0';
  (this->_starting_items)._M_elems[0x2c] = '\0';
  (this->_starting_items)._M_elems[0x2d] = '\0';
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x10] = '\0';
  (this->_starting_items)._M_elems[0x11] = '\0';
  (this->_starting_items)._M_elems[0x12] = '\0';
  (this->_starting_items)._M_elems[0x13] = '\0';
  (this->_starting_items)._M_elems[0x14] = '\0';
  (this->_starting_items)._M_elems[0x15] = '\0';
  (this->_starting_items)._M_elems[0x16] = '\0';
  (this->_starting_items)._M_elems[0x17] = '\0';
  (this->_starting_items)._M_elems[0x18] = '\0';
  (this->_starting_items)._M_elems[0x19] = '\0';
  (this->_starting_items)._M_elems[0x1a] = '\0';
  (this->_starting_items)._M_elems[0x1b] = '\0';
  (this->_starting_items)._M_elems[0x1c] = '\0';
  (this->_starting_items)._M_elems[0x1d] = '\0';
  (this->_starting_items)._M_elems[0x1e] = '\0';
  (this->_starting_items)._M_elems[0x1f] = '\0';
  (this->_starting_items)._M_elems[0] = '\0';
  (this->_starting_items)._M_elems[1] = '\0';
  (this->_starting_items)._M_elems[2] = '\0';
  (this->_starting_items)._M_elems[3] = '\0';
  (this->_starting_items)._M_elems[4] = '\0';
  (this->_starting_items)._M_elems[5] = '\0';
  (this->_starting_items)._M_elems[6] = '\0';
  (this->_starting_items)._M_elems[7] = '\0';
  (this->_starting_items)._M_elems[8] = '\0';
  (this->_starting_items)._M_elems[9] = '\0';
  (this->_starting_items)._M_elems[10] = '\0';
  (this->_starting_items)._M_elems[0xb] = '\0';
  (this->_starting_items)._M_elems[0xc] = '\0';
  (this->_starting_items)._M_elems[0xd] = '\0';
  (this->_starting_items)._M_elems[0xe] = '\0';
  (this->_starting_items)._M_elems[0xf] = '\0';
  this->_fix_armlet_skip = true;
  this->_remove_tree_cutting_glitch_drops = true;
  this->_consumable_record_book = false;
  this->_consumable_spell_book = false;
  this->_remove_gumi_boulder = false;
  this->_remove_tibor_requirement = false;
  this->_all_trees_visited_at_start = false;
  this->_ekeeke_auto_revive = true;
  this->_enemies_damage_factor = 100;
  this->_enemies_health_factor = 100;
  this->_enemies_armor_factor = 100;
  this->_enemies_golds_factor = 100;
  this->_enemies_drop_chance_factor = 100;
  this->_health_gained_per_lifestock = '\x01';
  this->_fast_transitions = true;
  this->_archipelago_world = false;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_finite_ground_items);
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_finite_shop_items);
  this->_seed = 0;
  this->_allow_spoiler_log = true;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->_possible_spawn_locations);
  this->_shuffle_tibor_trees = false;
  this->_shop_prices_factor = 100;
  this->_enemy_jumping_in_logic = false;
  this->_damage_boosting_in_logic = false;
  this->_tree_cutting_glitch_in_logic = false;
  this->_allow_whistle_usage_behind_trees = false;
  this->_ensure_ekeeke_in_shops = true;
  (this->_items_distribution)._M_elems[0x30] = '\0';
  (this->_items_distribution)._M_elems[0x31] = '\0';
  (this->_items_distribution)._M_elems[0x32] = '\0';
  (this->_items_distribution)._M_elems[0x33] = '\0';
  (this->_items_distribution)._M_elems[0x34] = '\0';
  (this->_items_distribution)._M_elems[0x35] = '\0';
  (this->_items_distribution)._M_elems[0x36] = '\0';
  (this->_items_distribution)._M_elems[0x37] = '\0';
  (this->_items_distribution)._M_elems[0x38] = '\0';
  (this->_items_distribution)._M_elems[0x39] = '\0';
  (this->_items_distribution)._M_elems[0x3a] = '\0';
  (this->_items_distribution)._M_elems[0x3b] = '\0';
  (this->_items_distribution)._M_elems[0x3c] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x20] = '\0';
  (this->_items_distribution)._M_elems[0x21] = '\0';
  (this->_items_distribution)._M_elems[0x22] = '\0';
  (this->_items_distribution)._M_elems[0x23] = '\0';
  (this->_items_distribution)._M_elems[0x24] = '\0';
  (this->_items_distribution)._M_elems[0x25] = '\0';
  (this->_items_distribution)._M_elems[0x26] = '\0';
  (this->_items_distribution)._M_elems[0x27] = '\0';
  (this->_items_distribution)._M_elems[0x28] = '\0';
  (this->_items_distribution)._M_elems[0x29] = '\0';
  (this->_items_distribution)._M_elems[0x2a] = '\0';
  (this->_items_distribution)._M_elems[0x2b] = '\0';
  (this->_items_distribution)._M_elems[0x2c] = '\0';
  (this->_items_distribution)._M_elems[0x2d] = '\0';
  (this->_items_distribution)._M_elems[0x2e] = '\0';
  (this->_items_distribution)._M_elems[0x2f] = '\0';
  (this->_items_distribution)._M_elems[0x10] = '\0';
  (this->_items_distribution)._M_elems[0x11] = '\0';
  (this->_items_distribution)._M_elems[0x12] = '\0';
  (this->_items_distribution)._M_elems[0x13] = '\0';
  (this->_items_distribution)._M_elems[0x14] = '\0';
  (this->_items_distribution)._M_elems[0x15] = '\0';
  (this->_items_distribution)._M_elems[0x16] = '\0';
  (this->_items_distribution)._M_elems[0x17] = '\0';
  (this->_items_distribution)._M_elems[0x18] = '\0';
  (this->_items_distribution)._M_elems[0x19] = '\0';
  (this->_items_distribution)._M_elems[0x1a] = '\0';
  (this->_items_distribution)._M_elems[0x1b] = '\0';
  (this->_items_distribution)._M_elems[0x1c] = '\0';
  (this->_items_distribution)._M_elems[0x1d] = '\0';
  (this->_items_distribution)._M_elems[0x1e] = '\0';
  (this->_items_distribution)._M_elems[0x1f] = '\0';
  (this->_items_distribution)._M_elems[0] = '\0';
  (this->_items_distribution)._M_elems[1] = '\0';
  (this->_items_distribution)._M_elems[2] = '\0';
  (this->_items_distribution)._M_elems[3] = '\0';
  (this->_items_distribution)._M_elems[4] = '\0';
  (this->_items_distribution)._M_elems[5] = '\0';
  (this->_items_distribution)._M_elems[6] = '\0';
  (this->_items_distribution)._M_elems[7] = '\0';
  (this->_items_distribution)._M_elems[8] = '\0';
  (this->_items_distribution)._M_elems[9] = '\0';
  (this->_items_distribution)._M_elems[10] = '\0';
  (this->_items_distribution)._M_elems[0xb] = '\0';
  (this->_items_distribution)._M_elems[0xc] = '\0';
  (this->_items_distribution)._M_elems[0xd] = '\0';
  (this->_items_distribution)._M_elems[0xe] = '\0';
  (this->_items_distribution)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x40] = '\0';
  (this->_items_distribution)._M_elems[0x41] = '\0';
  (this->_items_distribution)._M_elems[0x42] = '\0';
  (this->_items_distribution)._M_elems[0x43] = '\0';
  (this->_items_distribution)._M_elems[0x44] = '\0';
  this->_filler_item = '\0';
  this->_hints_distribution_region_requirement = '\0';
  this->_hints_distribution_item_requirement = '\0';
  this->_hints_distribution_item_location = '\0';
  this->_hints_distribution_dark_region = '\0';
  this->_hints_distribution_joke = '\0';
  this->_christmas_event = false;
  this->_secret_event = false;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_world_json,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_items,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_spawns,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_hint_sources,(nullptr_t)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=(&this->_item_names,item_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_spawn_location_names,spawn_location_names);
  permalink_string.field_2._M_local_buf[0xb] = '\0';
  std::array<unsigned_char,_62UL>::fill
            (&this->_starting_items,
             (value_type_conflict *)(permalink_string.field_2._M_local_buf + 0xb));
  permalink_string.field_2._M_local_buf[10] = '\0';
  std::array<unsigned_char,_69UL>::fill
            (&this->_items_distribution,
             (value_type_conflict *)(permalink_string.field_2._M_local_buf + 10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"permalink",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  ArgumentDictionary::get_string((string *)local_58,args,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (bVar1) {
    preset_path.field_2._8_8_ = std::chrono::_V2::system_clock::now();
    local_d0.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)((long)&preset_path.field_2 + 8));
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_d0);
    this->_seed = (uint32_t)rVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"preset",&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
    ArgumentDictionary::get_string((string *)local_f8,args,&local_118,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    stringtools::trim((string *)local_f8);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"stdin",&local_169);
      bVar1 = ArgumentDictionary::get_boolean(args,&local_168,true);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,
                        "Please specify a preset name (name of a file inside the \'presets\' folder, leave empty for default): "
                       );
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)local_f8);
        stringtools::trim((string *)local_f8);
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "default");
      }
    }
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,'/',0);
    if (sVar4 == 0xffffffffffffffff) {
      std::operator+(&local_190,"./presets/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_190);
      std::__cxx11::string::~string((string *)&local_190);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                      ".json");
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 ".json");
    }
    std::ifstream::ifstream(&local_398,(string *)local_f8,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&local_398 + *(long *)(local_398 + -0x18)));
    if ((bVar2 & 1) != 0) {
      local_3d9 = 1;
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_3d8,"Could not open preset file at given path \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+(&local_3b8,&local_3d8,"\'");
      LandstalkerException::LandstalkerException(this_00,&local_3b8);
      local_3d9 = 0;
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"silent",(allocator<char> *)((long)&preset_json.m_value + 7));
    bVar1 = ArgumentDictionary::get_boolean(args,&local_400,false);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)((long)&preset_json.m_value + 7));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Preset: \'");
      poVar5 = std::operator<<(poVar5,(string *)local_f8);
      std::operator<<(poVar5,"\'\n");
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_418,(nullptr_t)0x0);
    nlohmann::operator>>
              ((istream *)&local_398,
               (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_418);
    parse_json(this,(Json *)local_418);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_418);
    std::ifstream::~ifstream(&local_398);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    parse_permalink(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  validate(this);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

RandomizerOptions::RandomizerOptions(const ArgumentDictionary& args,
                                     const std::map<std::string, uint8_t>& item_names,
                                     const std::vector<std::string>& spawn_location_names)
{
    _item_names = item_names;
    _spawn_location_names = spawn_location_names;
    _starting_items.fill(0);
    _items_distribution.fill(0);

    std::string permalink_string = args.get_string("permalink");
    if(!permalink_string.empty())
    {
        // Permalink case: unpack it to find the preset and seed and generate the same world
        this->parse_permalink(permalink_string);
    }
    else
    {
        // Regular case: pick a random seed, read a preset file to get the config and generate a new world
        _seed = (uint32_t) std::chrono::system_clock::now().time_since_epoch().count();

        std::string preset_path = args.get_string("preset");
        stringtools::trim(preset_path);
        if(preset_path.empty())
        {
            if(args.get_boolean("stdin", true))
            {
                std::cout << "Please specify a preset name (name of a file inside the 'presets' folder, leave empty for default): ";
                std::getline(std::cin, preset_path);
                stringtools::trim(preset_path);
            }

            if(preset_path.empty())
                preset_path = "default";
        }

        // If a path was given, filter any kind of directories only keeping the last part of the path
        if(preset_path.find('/') == std::string::npos)
            preset_path = "./presets/" + preset_path;

        if(!preset_path.ends_with(".json"))
            preset_path += ".json";

        std::ifstream preset_file(preset_path);
        if(!preset_file)
            throw LandstalkerException("Could not open preset file at given path '" + preset_path + "'");

        if(!args.get_boolean("silent", false))
            std::cout << "Preset: '" << preset_path << "'\n";

        Json preset_json;
        preset_file >> preset_json;
        this->parse_json(preset_json);
    }

    this->validate();
}